

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_cp1(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int fs)

{
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *tcg_ctx;
  uint uVar1;
  uintptr_t o_1;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i64 pTVar5;
  TCGOpcode opc_00;
  uintptr_t o_7;
  uintptr_t o_2;
  TCGv_i64 arg;
  TCGTemp *local_68;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  s = ctx->uc->tcg_ctx;
  pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  arg = (TCGv_i64)((long)pTVar2 - (long)s);
  switch(opc << 0xb | opc + 0xbc000000 >> 0x15) {
  case 0:
    local_68 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)local_68 - (long)s);
    gen_load_fpr32((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i32)ctx->uc->tcg_ctx,
                   (int)pTVar3);
    goto LAB_00996484;
  case 1:
    gen_load_fpr64((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i64)ctx->uc->tcg_ctx,(int)arg)
    ;
    goto LAB_00996525;
  case 2:
    pTVar3 = tcg_const_i32_mips64el(s,fs);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_50 = (TCGTemp *)(pTVar3 + (long)s);
    tcg_gen_callN_mips64el(s,helper_cfc1_mips64el,(TCGTemp *)((long)s + (long)arg),2,&local_58);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
LAB_00996525:
    if ((rt == 0) || (pTVar5 = s->cpu_gpr[rt], pTVar5 == arg)) break;
    goto LAB_00996550;
  case 3:
    local_68 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)local_68 - (long)s);
    gen_load_fpr32h(ctx,pTVar3,fs);
LAB_00996484:
    tcg_gen_ext_i32_i64_mips64el(s,arg,pTVar3);
    tcg_temp_free_internal_mips64el(s,local_68);
    if ((rt != 0) && (pTVar5 = s->cpu_gpr[rt], pTVar5 != arg)) {
LAB_00996550:
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)s),(TCGArg)pTVar2);
    }
    break;
  case 4:
    if (rt == 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar2,0);
    }
    else if (s->cpu_gpr[rt] != arg) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)(s->cpu_gpr[rt] + (long)s));
    }
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    tcg_gen_extrl_i64_i32_mips64el(s,(TCGv_i32)((long)pTVar2 - (long)s),arg);
    gen_store_fpr32((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i32)ctx->uc->tcg_ctx,
                    (int)(TCGv_i32)((long)pTVar2 - (long)s));
    goto LAB_00996665;
  case 5:
    if (rt == 0) {
      opc_00 = INDEX_op_movi_i64;
      pTVar5 = (TCGv_i64)0x0;
LAB_0099667f:
      tcg_gen_op2_mips64el(s,opc_00,(TCGArg)pTVar2,(TCGArg)pTVar5);
    }
    else if (s->cpu_gpr[rt] != arg) {
      pTVar5 = s->cpu_gpr[rt] + (long)s;
      opc_00 = INDEX_op_mov_i64;
      goto LAB_0099667f;
    }
    gen_store_fpr64((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i64)ctx->uc->tcg_ctx,(int)arg
                   );
    break;
  case 6:
    if (rt == 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar2,0);
    }
    else if (s->cpu_gpr[rt] != arg) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)(s->cpu_gpr[rt] + (long)s));
    }
    if (ctx->hflags != ctx->saved_hflags) {
      tcg_ctx = ctx->uc->tcg_ctx;
      tcg_gen_op2_mips64el
                (tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->hflags + (long)tcg_ctx),
                 (long)(int)ctx->hflags);
      ctx->saved_hflags = ctx->hflags;
      uVar1 = ctx->hflags & 0x803800;
      if (((uVar1 == 0x800) || (uVar1 == 0x1800)) || (uVar1 == 0x1000)) {
        tcg_gen_op2_mips64el
                  (tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->btarget + (long)tcg_ctx),ctx->btarget
                  );
      }
    }
    pTVar3 = tcg_const_i32_mips64el(s,fs);
    pTVar4 = tcg_const_i32_mips64el(s,rt);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_50 = (TCGTemp *)((long)s + (long)arg);
    local_48 = (TCGTemp *)(pTVar3 + (long)s);
    local_40 = (TCGTemp *)(pTVar4 + (long)s);
    tcg_gen_callN_mips64el(s,helper_ctc1_mips64el,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
    (ctx->base).is_jmp = DISAS_TARGET_0;
    break;
  case 7:
    if (rt == 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar2,0);
    }
    else if (s->cpu_gpr[rt] != arg) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)(s->cpu_gpr[rt] + (long)s));
    }
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    tcg_gen_extrl_i64_i32_mips64el(s,(TCGv_i32)((long)pTVar2 - (long)s),arg);
    gen_store_fpr32h(ctx,(TCGv_i32)((long)pTVar2 - (long)s),fs);
LAB_00996665:
    tcg_temp_free_internal_mips64el(s,pTVar2);
    break;
  default:
    generate_exception_err(ctx,0x14,0);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg + (long)s));
  return;
}

Assistant:

static void gen_cp1(DisasContext *ctx, uint32_t opc, int rt, int fs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    switch (opc) {
    case OPC_MFC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_MTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
            gen_store_fpr32(ctx, fp0, fs);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_CFC1:
        gen_helper_1e0i(cfc1, t0, fs);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_CTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        save_cpu_state(ctx, 0);
        {
            TCGv_i32 fs_tmp = tcg_const_i32(tcg_ctx, fs);

            gen_helper_0e2i(ctc1, t0, fs_tmp, rt);
            tcg_temp_free_i32(tcg_ctx, fs_tmp);
        }
        /* Stop translation as we may have changed hflags */
        ctx->base.is_jmp = DISAS_STOP;
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMFC1:
        gen_load_fpr64(ctx, t0, fs);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_DMTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        gen_store_fpr64(ctx, t0, fs);
        break;
#endif
    case OPC_MFHC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32h(ctx, fp0, fs);
            tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_MTHC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
            gen_store_fpr32h(ctx, fp0, fs);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    default:
        MIPS_INVAL("cp1 move");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

 out:
    tcg_temp_free(tcg_ctx, t0);
}